

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_unm(jit_State *J,TRef rc,TValue *vc)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  int iVar3;
  TRef TVar4;
  double *in_RDX;
  jit_State *in_RDI;
  TRef zero;
  uint32_t k;
  IRType in_stack_ffffffffffffff7c;
  jit_State *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  undefined4 in_stack_ffffffffffffff90;
  TRef local_5c;
  
  local_5c = conv_str_tonum(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(TValue *)0x19d4d8);
  if ((local_5c >> 0x18 & 0x1f) - 0xf < 5) {
    iVar3 = (int)*in_RDX;
    IVar2 = (IRRef1)local_5c;
    if ((iVar3 != 0) && (iVar3 != -0x80000000)) {
      TVar4 = lj_ir_kint((jit_State *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                         CONCAT22(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c));
      IVar1 = (IRRef1)TVar4;
      (in_RDI->fold).ins.field_0.ot = 0x993;
      (in_RDI->fold).ins.field_0.op1 = IVar2;
      (in_RDI->fold).ins.field_0.op2 = IVar1;
      lj_opt_fold((jit_State *)
                  CONCAT26(in_stack_ffffffffffffff8e,
                           CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
      (in_RDI->fold).ins.field_0.ot = 0x3693;
      (in_RDI->fold).ins.field_0.op1 = IVar1;
      (in_RDI->fold).ins.field_0.op2 = IVar2;
      TVar4 = lj_opt_fold((jit_State *)
                          CONCAT26(in_stack_ffffffffffffff8e,
                                   CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
      return TVar4;
    }
    (in_RDI->fold).ins.field_0.ot = 0x590e;
    (in_RDI->fold).ins.field_0.op1 = IVar2;
    (in_RDI->fold).ins.field_0.op2 = 0x1d3;
    local_5c = lj_opt_fold((jit_State *)
                           CONCAT26(in_stack_ffffffffffffff8e,
                                    CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
  }
  IVar2 = (IRRef1)local_5c;
  TVar4 = lj_ir_ggfload(in_RDI,in_stack_ffffffffffffff7c,0x19d6b1);
  (in_RDI->fold).ins.field_0.ot = 0x2f0e;
  (in_RDI->fold).ins.field_0.op1 = IVar2;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
  TVar4 = lj_opt_fold((jit_State *)
                      CONCAT26(IVar2,CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)))
  ;
  return TVar4;
}

Assistant:

TRef lj_opt_narrow_unm(jit_State *J, TRef rc, TValue *vc)
{
  rc = conv_str_tonum(J, rc, vc);
  if (tref_isinteger(rc)) {
    uint32_t k = (uint32_t)numberVint(vc);
    if ((LJ_DUALNUM || k != 0) && k != 0x80000000u) {
      TRef zero = lj_ir_kint(J, 0);
      if (!LJ_DUALNUM)
	emitir(IRTGI(IR_NE), rc, zero);
      return emitir(IRTGI(IR_SUBOV), zero, rc);
    }
    rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
  }
  return emitir(IRTN(IR_NEG), rc, lj_ir_ksimd(J, LJ_KSIMD_NEG));
}